

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statistics.h
# Opt level: O1

void __thiscall CompilerStatistics::Finish(CompilerStatistics *this,char *keyName,uint timeMicros)

{
  int *piVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  InplaceStr key;
  InplaceStr local_38;
  
  this->finishTime = timeMicros;
  local_38.begin = keyName;
  sVar3 = strlen(keyName);
  local_38.end = keyName + sVar3;
  if ((this->timers).count != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      bVar2 = InplaceStr::operator==
                        ((InplaceStr *)((long)&(((this->timers).data)->keyName).begin + lVar4),
                         &local_38);
      if (bVar2) {
        if ((uint)uVar5 < (this->timers).count) {
          piVar1 = (int *)((long)&((this->timers).data)->total + lVar4);
          *piVar1 = *piVar1 + (timeMicros - this->startTime);
          this->startTime = 0;
          return;
        }
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<CompilerStatistics::Timer, 16>::operator[](unsigned int) [T = CompilerStatistics::Timer, N = 16]"
                     );
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x28;
    } while (uVar5 < (this->timers).count);
  }
  __assert_fail("!\"unknown timer\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Statistics.h"
                ,0x39,"void CompilerStatistics::Finish(const char *, unsigned int)");
}

Assistant:

void Finish(const char *keyName, unsigned timeMicros)
	{
		finishTime = timeMicros;

		InplaceStr key = InplaceStr(keyName);

		for(unsigned i = 0; i < timers.size(); i++)
		{
			if(timers[i].keyName == key)
			{
				timers[i].total += timeMicros - startTime;

				startTime = 0;
				return;
			}
		}

		assert(!"unknown timer");
	}